

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdBitOr(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  x86Reg reg2;
  
  reg1 = GenCodeLoadInt32FromRegister(ctx,cmd.rB,false);
  reg2 = GenCodeLoadInt32FromPointerIntoRegister(ctx,cmd.rC,cmd.argument);
  CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
            (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
  EMIT_OP_REG_REG(&ctx->ctx,o_or,reg1,reg2);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBX,(uint)((ulong)cmd >> 5) & 0x7f8,reg1);
  return;
}

Assistant:

void GenCodeCmdBitOr(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg lhsReg = GenCodeLoadInt32FromRegister(ctx, cmd.rB, false);
	x86Reg rhsReg = GenCodeLoadInt32FromPointerIntoRegister(ctx, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_or, lhsReg, rhsReg);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, lhsReg); // Store int to target
#else
	x86Reg lhsReg = x86GenCodeLoadInt32FromRegister(ctx, cmd.rB, false);
	x86Reg rhsReg = x86GenCodeLoadInt32FromPointerIntoRegister(ctx, cmd.rC, cmd.argument);

	ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

	EMIT_OP_REG_REG(ctx.ctx, o_or, lhsReg, rhsReg);

	EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, lhsReg); // Store int to target
#endif
}